

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  secp256k1_scalar *message;
  size_t n_pubkeys;
  secp256k1_scalar *seckey;
  uint uVar7;
  ulong uVar8;
  secp256k1_ge *pubkey_00;
  secp256k1_ge *ge_00;
  secp256k1_scalar *sigs;
  secp256k1_context *psVar9;
  secp256k1_context *psVar10;
  int *in_R8;
  byte bVar11;
  undefined1 *unaff_R12;
  secp256k1_ge *pubkey_01;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  uchar *puVar12;
  uint uVar13;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  secp256k1_scalar sStack_270;
  secp256k1_ge *psStack_248;
  secp256k1_ge *psStack_240;
  secp256k1_context *psStack_238;
  secp256k1_ge *psStack_230;
  secp256k1_ge *psStack_228;
  secp256k1_scalar sStack_220;
  ulong uStack_1f8;
  code *pcStack_1f0;
  char local_1e1;
  undefined8 local_1e0;
  undefined1 local_1d8 [65];
  uchar auStack_197 [7];
  secp256k1_ge *psStack_190;
  uint64_t local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  size_t local_148;
  int local_140;
  uint local_13c;
  uchar *local_138;
  ulong local_130;
  undefined1 local_128 [105];
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  secp256k1_ge local_98;
  secp256k1_ge *psVar14;
  
  local_148 = 3;
  local_1d8._60_4_ = xvalid;
  local_140 = yvalid;
  local_138 = input;
  do {
    local_128._65_8_ = *(undefined8 *)input;
    local_128._73_8_ = *(undefined8 *)(input + 8);
    local_128._81_8_ = *(undefined8 *)(input + 0x10);
    local_128._89_8_ = *(undefined8 *)(input + 0x18);
    local_128._97_8_ = *(undefined8 *)(input + 0x20);
    uStack_bf = *(undefined8 *)(input + 0x28);
    local_b7 = *(undefined8 *)(input + 0x30);
    uStack_af = *(undefined8 *)(input + 0x38);
    local_1e1 = local_1d8._60_4_ != 0 && local_148 == 0x21;
    local_13c = (uint)(local_148 == 0x41) * 4;
    local_130 = (ulong)(local_148 == 0x41 || local_148 == 0x21);
    uVar8 = 0;
    do {
      output = (secp256k1_ge *)(local_1d8 + 0x40);
      pubkey_00 = (secp256k1_ge *)0x0;
      local_128[0x40] = (char)uVar8;
      uVar7 = (uint)uVar8;
      uVar13 = input[0x3f] & 1 | 2;
      psVar14 = (secp256k1_ge *)(ulong)uVar13;
      if ((local_1d8._60_4_ == 0 || local_140 == 0) || (uVar7 & 4) != local_13c) {
        pubkey_01 = (secp256k1_ge *)0x0;
      }
      else {
        pubkey_01 = (secp256k1_ge *)
                    CONCAT71((int7)((ulong)unaff_R12 >> 8),
                             ((uVar7 & 0xfb) == uVar13 || uVar7 == 4) & (byte)local_130);
      }
      bVar11 = (byte)pubkey_01;
      psVar9 = CTX;
      if (((local_1e1 != '\0' && (uVar7 & 0xfe) == 2) | bVar11) != 1) {
        local_128._48_8_ = 0xfefefefefefefefe;
        local_128._56_8_ = 0xfefefefefefefefe;
        local_128._32_8_ = 0xfefefefefefefefe;
        local_128._40_4_ = -0x1010102;
        local_128._44_4_ = -0x1010102;
        local_128._16_8_ = 0xfefefefefefefefe;
        local_128._24_8_ = 0xfefefefefefefefe;
        local_128._0_8_ = 0xfefefefefefefefe;
        local_128._8_8_ = 0xfefefefefefefefe;
        stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430001;
        pubkey_01 = (secp256k1_ge *)local_128;
        local_188 = 0x40;
        local_180._0_4_ = 0;
        local_180._4_4_ = 0;
        local_178._0_4_ = 0;
        local_178._4_4_ = 0;
        local_170 = 0;
        local_1d8._0_8_ = 0;
        pcStack_1f0 = (code *)0x15045c;
        ge_00 = pubkey_01;
        psStack_190 = pubkey_01;
        iVar4 = secp256k1_ec_pubkey_parse
                          (CTX,(secp256k1_pubkey *)pubkey_01,local_128 + 0x40,local_148);
        psVar10 = CTX;
        if (iVar4 != 0) {
          pcStack_1f0 = (code *)0x15057d;
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_0015057d;
        }
        local_188 = 0x40;
        local_180._0_4_ = 0;
        local_180._4_4_ = 0;
        local_178._0_4_ = 0;
        local_178._4_4_ = 0;
        local_170 = 0;
        local_1d8._0_8_ = 0;
        unique0x10000843 = (CTX->illegal_callback).fn;
        psStack_190 = (secp256k1_ge *)(CTX->illegal_callback).data;
        if (secp256k1_context_static == CTX) {
          pcStack_1f0 = (code *)0x150550;
          (*(CTX->illegal_callback).fn)
                    ("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
          psVar9 = CTX;
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar10->illegal_callback).data = local_1d8;
          psVar9 = psVar10;
        }
        ge_00 = &local_98;
        pcStack_1f0 = (code *)0x1504fd;
        iVar4 = secp256k1_pubkey_load(psVar9,ge_00,(secp256k1_pubkey *)pubkey_01);
        psVar10 = CTX;
        if (iVar4 != 0) goto LAB_00150587;
        (CTX->illegal_callback).fn = stack0xfffffffffffffe68;
        (psVar10->illegal_callback).data = psStack_190;
        if (local_1d8._0_4_ == 1) goto LAB_0015052c;
LAB_0015058c:
        pcStack_1f0 = (code *)0x150591;
        ec_pubkey_parse_pointtest_cold_3();
        puVar12 = input;
LAB_00150591:
        input = puVar12;
        pcStack_1f0 = (code *)0x150596;
        ec_pubkey_parse_pointtest_cold_4();
LAB_00150596:
        pcStack_1f0 = (code *)0x15059b;
        ec_pubkey_parse_pointtest_cold_12();
LAB_0015059b:
        pcStack_1f0 = (code *)0x1505a0;
        ec_pubkey_parse_pointtest_cold_6();
        output_00 = psVar14;
LAB_001505a0:
        pcStack_1f0 = (code *)0x1505a5;
        ec_pubkey_parse_pointtest_cold_11();
LAB_001505a5:
        pcStack_1f0 = (code *)0x1505aa;
        ec_pubkey_parse_pointtest_cold_10();
LAB_001505aa:
        pcStack_1f0 = (code *)0x1505af;
        ec_pubkey_parse_pointtest_cold_7();
        psVar14 = output_00;
LAB_001505af:
        pcStack_1f0 = (code *)0x1505b4;
        ec_pubkey_parse_pointtest_cold_8();
        output_00 = output;
LAB_001505b4:
        pcStack_1f0 = (code *)0x1505b9;
        ec_pubkey_parse_pointtest_cold_5();
LAB_001505b9:
        pcStack_1f0 = test_sort_helper;
        ec_pubkey_parse_pointtest_cold_9();
        pcStack_1f0 = (code *)input;
        uStack_1f8 = uVar8;
        sigs = &sStack_220;
        if (n_pubkeys == 0) {
          psStack_228 = (secp256k1_ge *)0x150636;
          secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&sStack_220,0);
        }
        else {
          sVar6 = 0;
          do {
            sStack_220.d[sVar6] =
                 (uint64_t)
                 ((&(psVar9->ecmult_gen_ctx).scalar_offset)[(ge_00->x).n[sVar6] * 2 + -1].d + 3);
            sVar6 = sVar6 + 1;
          } while (n_pubkeys != sVar6);
          psStack_228 = (secp256k1_ge *)0x1505fb;
          psVar10 = CTX;
          secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&sStack_220,n_pubkeys);
          sVar6 = 0;
          do {
            message = (secp256k1_scalar *)sStack_220.d[sVar6];
            lVar5 = 0;
            do {
              cVar1 = *(char *)((long)message->d + lVar5);
              sigs = (secp256k1_scalar *)CONCAT71((int7)((ulong)sigs >> 8),cVar1);
              if (cVar1 != *(char *)((long)(psVar9->ecmult_gen_ctx).scalar_offset.d + lVar5 + -8)) {
                psStack_228 = (secp256k1_ge *)random_sign;
                test_sort_helper_cold_1();
                psStack_248 = pubkey_01;
                psStack_240 = output_00;
                psStack_238 = psVar9;
                psStack_230 = psVar14;
                psStack_228 = pubkey_00;
                do {
                  testutil_random_scalar_order_test(&sStack_270);
                  iVar4 = secp256k1_ecdsa_sig_sign
                                    (&CTX->ecmult_gen_ctx,(secp256k1_scalar *)psVar10,sigs,seckey,
                                     message,&sStack_270,in_R8);
                } while (iVar4 == 0);
                return;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x40);
            sVar6 = sVar6 + 1;
            psVar9 = (secp256k1_context *)((psVar9->ecmult_gen_ctx).ge_offset.x.n + 3);
          } while (sVar6 != n_pubkeys);
        }
        return;
      }
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      local_128._16_8_ = 0;
      local_128._24_8_ = 0;
      local_128._32_8_ = 0;
      local_128._40_4_ = 0;
      local_128._44_4_ = 0;
      local_128._48_8_ = 0;
      local_128._56_8_ = 0;
      stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430001;
      puVar12 = (uchar *)0x0;
      pubkey_00 = (secp256k1_ge *)local_128;
      local_188 = 0x40;
      local_180._0_4_ = 0;
      local_180._4_4_ = 0;
      local_178._0_4_ = 0;
      local_178._4_4_ = 0;
      local_170 = 0;
      local_1d8._0_8_ = 0;
      pcStack_1f0 = (code *)0x150063;
      ge_00 = pubkey_00;
      psStack_190 = pubkey_00;
      iVar4 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)pubkey_00,local_128 + 0x40,local_148);
      input = puVar12;
      if (iVar4 == 0) {
LAB_0015057d:
        pcStack_1f0 = (code *)0x150582;
        ec_pubkey_parse_pointtest_cold_14();
        puVar12 = input;
LAB_00150582:
        pcStack_1f0 = (code *)0x150587;
        ec_pubkey_parse_pointtest_cold_13();
        input = puVar12;
LAB_00150587:
        pcStack_1f0 = (code *)0x15058c;
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_0015058c;
      }
      stack0xfffffffffffffe68 = (_func_void_char_ptr_void_ptr *)0x4d430005;
      local_188 = 0x40;
      local_180._0_4_ = 0;
      local_180._4_4_ = 0;
      local_178._0_4_ = 0;
      local_178._4_4_ = 0;
      local_170 = 0;
      local_1d8._48_8_ = 0x41;
      local_1d8._0_8_ = 0x4d430001;
      local_1d8._16_8_ = 0x41;
      local_1d8._24_8_ = 0;
      local_1d8._32_8_ = 0;
      local_1d8._40_4_ = 0;
      local_1d8._44_4_ = 0;
      local_1e0 = 0;
      in_R8 = (int *)&DAT_00000102;
      pcStack_1f0 = (code *)0x150120;
      ge_00 = output;
      psVar9 = CTX;
      local_1d8._8_8_ = output;
      psStack_190 = pubkey_00;
      iVar4 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output,(size_t *)(local_1d8 + 0x30),
                         (secp256k1_pubkey *)pubkey_00,0x102);
      input = local_138;
      if (iVar4 == 0) goto LAB_00150582;
      local_1d8._0_8_ = 0x4d430005;
      local_1d8._8_8_ = output;
      local_1d8._16_8_ = local_1d8._48_8_;
      local_1d8._24_8_ = 0;
      local_1d8._32_8_ = 0;
      local_1d8._40_4_ = 0;
      local_1d8._44_4_ = 0;
      uVar2 = (ulong)((long)psVar9 << 3) >> 0x33;
      uVar3 = (((long)psVar9 << 3 | (ulong)psVar9 >> 0x3d) << 0xd | uVar2) >> 3;
      psVar9 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
      local_1e0 = 0;
      pubkey_00 = (secp256k1_ge *)0x0;
      if (local_1d8._48_8_ != 0x21) goto LAB_00150591;
      lVar5 = 1;
      do {
        output_00 = output;
        if (local_1d8[lVar5 + 0x40] != local_128[lVar5 + 0x40]) goto LAB_001505b4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x21);
      if ((local_148 == 0x21) && (local_1d8[0x40] != local_128[0x40])) goto LAB_00150596;
      pubkey_01 = (secp256k1_ge *)local_128;
      if (bVar11 != 0) {
        if (local_1d8[0x40] != (char)uVar13) goto LAB_0015059b;
        pcStack_1f0 = (code *)0x1501fe;
        ge_00 = &local_98;
        psVar9 = CTX;
        iVar4 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)pubkey_01);
        output_00 = &local_98;
        if (iVar4 == 0) goto LAB_001505a0;
        local_128._48_8_ = 0;
        local_128._56_8_ = 0;
        local_128._32_8_ = 0;
        local_128._40_4_ = 0;
        local_128._44_4_ = 0;
        local_128._16_8_ = 0;
        local_128._24_8_ = 0;
        local_128._0_8_ = 0;
        local_128._8_8_ = 0;
        local_1d8._0_8_ = 0x4d430001;
        local_1d8._16_8_ = 0x40;
        local_1d8._24_8_ = 0;
        local_1d8._32_8_ = 0;
        local_1d8._40_4_ = 0;
        local_1d8._44_4_ = 0;
        output = (secp256k1_ge *)local_1d8;
        local_1e0 = 0;
        pcStack_1f0 = (code *)0x150283;
        local_1d8._8_8_ = pubkey_01;
        secp256k1_pubkey_save((secp256k1_pubkey *)pubkey_01,&local_98);
        local_1d8._48_8_ = 0x41;
        local_1d8._0_8_ = 0x4d430001;
        output_00 = (secp256k1_ge *)(local_1d8 + 0x40);
        local_1d8._16_8_ = 0x41;
        local_1d8._24_8_ = 0;
        local_1d8._32_8_ = 0;
        local_1d8._40_4_ = 0;
        local_1d8._44_4_ = 0;
        local_1e0 = 0;
        in_R8 = (int *)0x2;
        pcStack_1f0 = (code *)0x15033d;
        ge_00 = output_00;
        psVar9 = CTX;
        local_1d8._8_8_ = output_00;
        iVar4 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)output_00,(size_t *)(local_1d8 + 0x30),
                           (secp256k1_pubkey *)pubkey_01,2);
        if (iVar4 == 0) goto LAB_001505a5;
        local_1d8._0_8_ = 0x4d430005;
        local_1d8._8_8_ = output_00;
        local_1d8._16_8_ = local_1d8._48_8_;
        local_1d8._24_8_ = 0;
        local_1d8._32_8_ = 0;
        local_1d8._40_4_ = 0;
        local_1d8._44_4_ = 0;
        uVar2 = (ulong)((long)psVar9 << 3) >> 0x33;
        uVar3 = (((long)psVar9 << 3 | (ulong)psVar9 >> 0x3d) << 0xd | uVar2) >> 3;
        psVar9 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
        local_1e0 = 0;
        if (local_1d8._48_8_ == 0x41) {
          psVar14 = output_00;
          if (local_1d8[0x40] != '\x04') goto LAB_001505af;
          lVar5 = 0;
          do {
            if (auStack_197[lVar5] != input[lVar5]) goto LAB_001505b9;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x40);
          goto LAB_0015052c;
        }
        goto LAB_001505aa;
      }
LAB_0015052c:
      unaff_R12 = local_128;
      uVar8 = (ulong)(uVar7 + 1);
    } while (uVar7 + 1 != 0x100);
    local_148 = local_148 + 1;
    if (local_148 == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}